

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void helics::Federate::setTranslatorOperator
               (Filter *trans,shared_ptr<helics::TranslatorOperator> *transOps)

{
  shared_ptr<helics::TranslatorOperator> local_18;
  
  local_18.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (transOps->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_18.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (transOps->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (transOps->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (transOps->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  Translator::setOperator((Translator *)trans,&local_18);
  if (local_18.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_18.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Federate::setTranslatorOperator(Translator& trans,
                                     std::shared_ptr<TranslatorOperator> transOps)
{
    trans.setOperator(std::move(transOps));
}